

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_9bdda5::HandleRandomCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  pointer pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  uint __seed;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  string_view value;
  allocator<char> local_dd;
  uint local_dc;
  vector<char,_std::allocator<char>_> result;
  string alphabet;
  char cmStringCommandDefaultAlphabet [63];
  
  uVar11 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  if ((uVar11 < 6) && ((0x2bUL >> (uVar11 & 0x3f) & 1) != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)cmStringCommandDefaultAlphabet,
               "sub-command RANDOM requires at least one argument.",(allocator<char> *)&alphabet);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)cmStringCommandDefaultAlphabet);
    return false;
  }
  builtin_strncpy(cmStringCommandDefaultAlphabet + 0x20,"UIOPASDFGHJKLZXCVBNM0123456789",0x1f);
  builtin_strncpy(cmStringCommandDefaultAlphabet + 0x10,"jklzxcvbnmQWERTY",0x10);
  alphabet._M_dataplus._M_p = (pointer)&alphabet.field_2;
  alphabet._M_string_length = 0;
  builtin_strncpy(cmStringCommandDefaultAlphabet,"qwertyuiopasdfgh",0x10);
  alphabet.field_2._M_local_buf[0] = '\0';
  if (uVar11 < 4) {
    iVar6 = 5;
    uVar10 = 0;
    __seed = 0;
LAB_00274c7b:
    std::__cxx11::string::assign((char *)&alphabet);
    if (alphabet._M_string_length != 0) goto LAB_00274c98;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"sub-command RANDOM invoked with bad alphabet.",&local_dd);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    __seed = 0;
    iVar6 = 5;
    local_dc = 0;
    for (uVar9 = 1; uVar9 < uVar11 - 2; uVar9 = uVar9 + 1) {
      bVar5 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar9,"LENGTH");
      if (bVar5) {
        uVar9 = uVar9 + 1;
        iVar6 = atoi((args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
      }
      else {
        bVar5 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar9,"ALPHABET");
        if (bVar5) {
          uVar9 = uVar9 + 1;
          std::__cxx11::string::_M_assign((string *)&alphabet);
        }
        else {
          bVar5 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9,"RANDOM_SEED");
          if (bVar5) {
            uVar9 = uVar9 + 1;
            __seed = atoi((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
            local_dc = (uint)CONCAT71((uint7)(uint3)(__seed >> 8),1);
          }
        }
      }
    }
    uVar10 = local_dc;
    if (alphabet._M_string_length == 0) goto LAB_00274c7b;
LAB_00274c98:
    sVar4 = alphabet._M_string_length;
    if (0 < iVar6) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (((~(anonymous_namespace)::
             HandleRandomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
             ::seeded | (byte)uVar10) & 1) != 0) {
        (anonymous_namespace)::
        HandleRandomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::seeded = 1;
        if ((uVar10 & 1) == 0) {
          __seed = cmSystemTools::RandomSeed();
        }
        srand(__seed);
      }
      _Var3._M_p = alphabet._M_dataplus._M_p;
      auVar12._8_4_ = (int)(sVar4 >> 0x20);
      auVar12._0_8_ = sVar4;
      auVar12._12_4_ = 0x45300000;
      while (bVar5 = iVar6 != 0, iVar6 = iVar6 + -1, bVar5) {
        iVar7 = rand();
        std::vector<char,_std::allocator<char>_>::push_back
                  (&result,_Var3._M_p +
                           (int)((double)iVar7 *
                                 ((auVar12._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                4.656612873077393e-10));
      }
      local_dd = (allocator<char>)0x0;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&result,(char *)&local_dd);
      pcVar2 = result.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      this = status->Makefile;
      sVar8 = strlen(result.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
      value._M_str = pcVar2;
      value._M_len = sVar8;
      cmMakefile::AddDefinition(this,pbVar1 + -1,value);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&result.super__Vector_base<char,_std::allocator<char>_>);
      bVar5 = true;
      goto LAB_00274de3;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"sub-command RANDOM invoked with bad length.",&local_dd);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)&result);
  bVar5 = false;
LAB_00274de3:
  std::__cxx11::string::~string((string *)&alphabet);
  return bVar5;
}

Assistant:

bool HandleRandomCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2 || args.size() == 3 || args.size() == 5) {
    status.SetError("sub-command RANDOM requires at least one argument.");
    return false;
  }

  static bool seeded = false;
  bool force_seed = false;
  unsigned int seed = 0;
  int length = 5;
  const char cmStringCommandDefaultAlphabet[] = "qwertyuiopasdfghjklzxcvbnm"
                                                "QWERTYUIOPASDFGHJKLZXCVBNM"
                                                "0123456789";
  std::string alphabet;

  if (args.size() > 3) {
    size_t i = 1;
    size_t stopAt = args.size() - 2;

    for (; i < stopAt; ++i) {
      if (args[i] == "LENGTH") {
        ++i;
        length = atoi(args[i].c_str());
      } else if (args[i] == "ALPHABET") {
        ++i;
        alphabet = args[i];
      } else if (args[i] == "RANDOM_SEED") {
        ++i;
        seed = static_cast<unsigned int>(atoi(args[i].c_str()));
        force_seed = true;
      }
    }
  }
  if (alphabet.empty()) {
    alphabet = cmStringCommandDefaultAlphabet;
  }

  double sizeofAlphabet = static_cast<double>(alphabet.size());
  if (sizeofAlphabet < 1) {
    status.SetError("sub-command RANDOM invoked with bad alphabet.");
    return false;
  }
  if (length < 1) {
    status.SetError("sub-command RANDOM invoked with bad length.");
    return false;
  }
  const std::string& variableName = args.back();

  std::vector<char> result;

  if (!seeded || force_seed) {
    seeded = true;
    srand(force_seed ? seed : cmSystemTools::RandomSeed());
  }

  const char* alphaPtr = alphabet.c_str();
  for (int cc = 0; cc < length; cc++) {
    int idx = static_cast<int>(sizeofAlphabet * rand() / (RAND_MAX + 1.0));
    result.push_back(*(alphaPtr + idx));
  }
  result.push_back(0);

  status.GetMakefile().AddDefinition(variableName, result.data());
  return true;
}